

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int skip_compound_using_best_single_mode_ref
              (PREDICTION_MODE this_mode,MV_REFERENCE_FRAME *ref_frames,
              PREDICTION_MODE *best_single_mode,int prune_comp_using_best_single_mode_ref)

{
  char cVar1;
  PREDICTION_MODE PVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  PREDICTION_MODE in_DIL;
  PREDICTION_MODE single_mode;
  int newmv_dir;
  PREDICTION_MODE comp_mode_ref0;
  int local_4;
  
  if ((((in_DIL == '\x11') || (in_DIL == '\x12')) || (in_DIL == '\x18')) || (in_DIL == '\x17')) {
    local_4 = 0;
  }
  else {
    PVar2 = compound_ref0_mode(in_DIL);
    cVar1 = *(char *)(in_RDX + *(char *)(in_RSI + (int)(uint)(PVar2 != '\x10')));
    if (cVar1 == '\x10') {
      local_4 = 0;
    }
    else if ((in_ECX == 1) && (cVar1 == '\x19')) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static inline int skip_compound_using_best_single_mode_ref(
    const PREDICTION_MODE this_mode, const MV_REFERENCE_FRAME *ref_frames,
    const PREDICTION_MODE *best_single_mode,
    int prune_comp_using_best_single_mode_ref) {
  // Exclude non-extended compound modes from pruning
  if (this_mode == NEAREST_NEARESTMV || this_mode == NEAR_NEARMV ||
      this_mode == NEW_NEWMV || this_mode == GLOBAL_GLOBALMV)
    return 0;

  assert(this_mode >= NEAREST_NEWMV && this_mode <= NEW_NEARMV);
  const PREDICTION_MODE comp_mode_ref0 = compound_ref0_mode(this_mode);
  // Get ref frame direction corresponding to NEWMV
  // 0 - NEWMV corresponding to forward direction
  // 1 - NEWMV corresponding to backward direction
  const int newmv_dir = comp_mode_ref0 != NEWMV;

  // Avoid pruning the compound mode when ref frame corresponding to NEWMV
  // have NEWMV as single mode winner.
  // Example: For an extended-compound mode,
  // {mode, {fwd_frame, bwd_frame}} = {NEAR_NEWMV, {LAST_FRAME, ALTREF_FRAME}}
  // - Ref frame corresponding to NEWMV is ALTREF_FRAME
  // - Avoid pruning this mode, if best single mode corresponding to ref frame
  //   ALTREF_FRAME is NEWMV
  const PREDICTION_MODE single_mode = best_single_mode[ref_frames[newmv_dir]];
  if (single_mode == NEWMV) return 0;

  // Avoid pruning the compound mode when best single mode is not available
  if (prune_comp_using_best_single_mode_ref == 1)
    if (single_mode == MB_MODE_COUNT) return 0;
  return 1;
}